

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.hpp
# Opt level: O2

void __thiscall actorpp::RecvThread::run(RecvThread *this)

{
  ssize_t sVar1;
  uint uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  undefined4 local_4c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,0x80,
               (allocator_type *)&local_4c);
    sVar1 = recv(this->fd,local_48._M_impl.super__Vector_impl_data._M_start,
                 (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48._M_impl.super__Vector_impl_data._M_start,0);
    uVar2 = (uint)sVar1;
    if ((int)uVar2 < 1) {
      local_4c = 0;
      Channel<actorpp::CloseReason>::push<actorpp::CloseReason>
                (&this->on_close,(CloseReason *)&local_4c);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                 (ulong)(uVar2 & 0x7fffffff));
      Channel<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
      push<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Channel<std::vector<unsigned_char,std::allocator<unsigned_char>>> *)
                 &this->on_message,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  } while (0 < (int)uVar2);
  return;
}

Assistant:

void run() {
    while (true) {
      std::vector<uint8_t> buf(128);
      int bytes_read = recv(fd, buf.data(), buf.size(), 0);
      if (bytes_read > 0) {
        buf.resize(bytes_read);
        on_message.push(std::move(buf));
      } else {
        on_close.push(CloseReason::Normal);
        break;
      }
    }
  }